

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall Imf_2_5::anon_unknown_15::LineCompositeTask::execute(LineCompositeTask *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_000001d0;
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  *in_stack_000001d8;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_000001e0;
  Data *in_stack_000001e8;
  int in_stack_000001f0;
  int in_stack_000001f4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000200;
  
  composite_line(in_stack_000001f4,in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,
                 in_stack_000001d8,in_stack_000001d0,in_stack_00000200);
  return;
}

Assistant:

void LineCompositeTask::execute()
{
  composite_line(_y,_start,_Data,*_names,*_pointers,*_total_sizes,*_num_sources);
}